

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

string * ElideMiddle(string *__return_storage_ptr__,string *str,size_t width)

{
  pointer pcVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  long *local_80;
  undefined8 local_78;
  long local_70;
  undefined8 uStack_68;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(width) {
  case 0:
    pcVar5 = "";
    pcVar6 = "";
    break;
  case 1:
    pcVar6 = ".";
    pcVar5 = "";
    break;
  case 2:
    pcVar6 = "..";
    pcVar5 = "";
    break;
  case 3:
    pcVar6 = "...";
    pcVar5 = "";
    break;
  default:
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
    if (__return_storage_ptr__->_M_string_length <= width) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)local_40,(ulong)__return_storage_ptr__);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_40);
    puVar4 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar4) {
      local_90 = *puVar4;
      lStack_88 = plVar2[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *puVar4;
      local_a0 = (ulong *)*plVar2;
    }
    local_98 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::substr((ulong)&local_60,(ulong)__return_storage_ptr__);
    uVar7 = 0xf;
    if (local_a0 != &local_90) {
      uVar7 = local_90;
    }
    if (uVar7 < (ulong)(local_58 + local_98)) {
      uVar7 = 0xf;
      if (local_60 != local_50) {
        uVar7 = local_50[0];
      }
      if ((ulong)(local_58 + local_98) <= uVar7) {
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_a0);
        goto LAB_0011cc7b;
      }
    }
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60);
LAB_0011cc7b:
    local_80 = &local_70;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_70 = *plVar2;
      uStack_68 = puVar3[3];
    }
    else {
      local_70 = *plVar2;
      local_80 = (long *)*puVar3;
    }
    local_78 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_40[0] == local_30) {
      return __return_storage_ptr__;
    }
    operator_delete(local_40[0],local_30[0] + 1);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

string ElideMiddle(const string& str, size_t width) {
  switch (width) {
      case 0: return "";
      case 1: return ".";
      case 2: return "..";
      case 3: return "...";
  }
  const int kMargin = 3;  // Space for "...".
  string result = str;
  if (result.size() > width) {
    size_t elide_size = (width - kMargin) / 2;
    result = result.substr(0, elide_size)
      + "..."
      + result.substr(result.size() - elide_size, elide_size);
  }
  return result;
}